

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O1

void PoolAllocPages(MemoryPool *pool,size_t number)

{
  long lVar1;
  int *piVar2;
  byte *pbVar3;
  uint uVar4;
  Page *pacVar5;
  Page *pacVar6;
  byte bVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  AddressRange *pAVar12;
  long lVar13;
  char *pcVar14;
  Page *pacVar15;
  AddressRange *pAVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t i;
  ulong uVar21;
  size_t size;
  AddressRange **ppAVar22;
  Page *addr;
  ulong __denom;
  bool bVar23;
  lldiv_t lVar24;
  
  pvVar9 = pthread_getspecific(tsdKey);
  __denom = systemPageSize >> 0xc;
  uVar20 = 1;
  if (number != 1) {
    lVar24 = lldiv(number,__denom);
    uVar20 = (lVar24.quot + 1) - (ulong)(lVar24.rem == 0);
    __denom = (__denom * uVar20 - number) + 1;
    if (0x7f < uVar20) {
      __denom = 1;
    }
  }
  uVar4 = pool->generation;
  if ((uVar20 < 0x81) && (((allocGranularity >> ((byte)shiftPage & 0x3f)) + 0xff & uVar20) != 0)) {
    pvVar10 = pthread_getspecific(tsdKey);
    iVar8 = *(int *)((long)pvVar10 + 0x460);
    *(int *)((long)pvVar10 + 0x460) = iVar8 + 1;
    if (iVar8 == 0) {
      pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
    }
    bVar23 = ranges == (AddressRange *)0x0;
    ppAVar22 = &ranges;
    pAVar12 = ranges;
    if (bVar23) {
      uVar11 = 0;
      uVar17 = 0xffffffffffffffff;
    }
    else {
      bVar23 = false;
      do {
        pAVar16 = pAVar12;
        uVar11 = pAVar16->size;
        if (uVar20 <= pAVar16->free) {
          uVar21 = pAVar16->first;
          pAVar12 = pAVar16;
          if ((uVar20 == 1) && (uVar17 = uVar21, *(char *)((long)&pAVar16[1].next + uVar21) == '\0')
             ) goto LAB_00106479;
          uVar17 = 0xffffffffffffffff;
          uVar18 = uVar20;
          if (uVar21 < uVar11) {
            do {
              uVar19 = uVar20;
              if (*(char *)((long)&pAVar16[1].next + uVar21) == '\0') {
                if (uVar18 == uVar20) {
                  uVar17 = uVar21;
                }
                uVar19 = uVar18 - 1;
                if (uVar18 - 1 == 0) goto LAB_00106383;
              }
              uVar21 = uVar21 + 1;
              uVar18 = uVar19;
            } while (uVar11 != uVar21);
            uVar17 = 0xffffffffffffffff;
          }
LAB_00106383:
          if (uVar17 != 0xffffffffffffffff) goto LAB_00106479;
        }
        pAVar12 = pAVar16->next;
        bVar23 = pAVar12 == (AddressRange *)0x0;
        ppAVar22 = &pAVar16->next;
      } while (!bVar23);
      uVar17 = 0xffffffffffffffff;
LAB_00106479:
      uVar11 = uVar11 * 2;
    }
    if (bVar23) {
      uVar17 = 0x8000;
      if (uVar11 < 0x8000) {
        uVar17 = uVar11;
      }
      size = 0x100;
      if (ranges != (AddressRange *)0x0) {
        size = uVar17;
      }
      pvVar10 = PlatReserveRange(size,0);
      if (pvVar10 != (void *)0x0) {
        uVar11 = size + 7 >> 3;
        pAVar12 = (AddressRange *)malloc(uVar11 + size + 0x28);
        ((AddressRange *)ppAVar22)->next = pAVar12;
        pAVar12->base = pvVar10;
        uVar17 = 0;
        pAVar12->next = (AddressRange *)0x0;
        pAVar12->size = size;
        pAVar12->free = size;
        pAVar12->first = 0;
        memset(pAVar12 + 1,0,uVar11 + size);
        goto LAB_00106508;
      }
      pcVar14 = "Address range reservation failed";
      addr = (Page *)0x0;
LAB_001065c6:
      Col_Error(COL_FATAL,ColibriDomain,2,pcVar14);
    }
    else {
LAB_00106508:
      addr = (Page *)((uVar17 << ((byte)shiftPage & 0x3f)) + (long)pAVar12->base);
      iVar8 = PlatAllocPages(addr,uVar20);
      if (iVar8 == 0) {
        pcVar14 = "Page allocation failed";
        goto LAB_001065c6;
      }
      *(char *)((long)&pAVar12[1].next + uVar17) = -(char)uVar20;
      if (1 < uVar20) {
        lVar13 = 0;
        do {
          lVar1 = lVar13 + 1;
          *(char *)((long)&pAVar12[1].next + lVar13 + uVar17 + 1) = (char)lVar1;
          lVar13 = lVar1;
        } while (uVar20 - 1 != lVar1);
      }
      bVar7 = '\x01' << ((byte)uVar17 & 7);
      if (uVar4 < 2) {
        pbVar3 = (byte *)((long)&pAVar12[1].next + (uVar17 >> 3) + pAVar12->size);
        *pbVar3 = *pbVar3 & ~bVar7;
      }
      else {
        pbVar3 = (byte *)((long)&pAVar12[1].next + (uVar17 >> 3) + pAVar12->size);
        *pbVar3 = *pbVar3 | bVar7;
      }
      pAVar12->free = pAVar12->free - uVar20;
      if (uVar17 == pAVar12->first) {
        pAVar12->first = pAVar12->first + uVar20;
      }
    }
    pvVar10 = pthread_getspecific(tsdKey);
    piVar2 = (int *)((long)pvVar10 + 0x460);
    *piVar2 = *piVar2 + -1;
    iVar8 = *piVar2;
  }
  else {
    addr = (Page *)PlatReserveRange(uVar20,1);
    if (addr == (Page *)0x0) {
      addr = (Page *)0x0;
      Col_Error(COL_FATAL,ColibriDomain,2,"Address range allocation failed");
      goto LAB_001065fb;
    }
    pvVar10 = pthread_getspecific(tsdKey);
    iVar8 = *(int *)((long)pvVar10 + 0x460);
    *(int *)((long)pvVar10 + 0x460) = iVar8 + 1;
    if (iVar8 == 0) {
      pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
    }
    pAVar12 = (AddressRange *)malloc(0x29);
    pAVar12->next = dedicatedRanges;
    pAVar12->base = addr;
    pAVar12->size = uVar20;
    pAVar12->free = 0;
    pAVar12->first = uVar20;
    *(bool *)&pAVar12[1].next = 1 < uVar4;
    dedicatedRanges = pAVar12;
    pvVar10 = pthread_getspecific(tsdKey);
    piVar2 = (int *)((long)pvVar10 + 0x460);
    *piVar2 = *piVar2 + -1;
    iVar8 = *piVar2;
  }
  if (iVar8 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&mutexRange);
  }
LAB_001065fb:
  if (pool->pages == (Page *)0x0) {
    pool->pages = addr;
    lVar13 = 0;
    do {
      pool->lastFreeCell[lVar13] = (Cell *)addr;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x7f);
  }
  pool->nbPages = pool->nbPages + __denom;
  pool->nbAlloc = pool->nbAlloc + __denom;
  pool->nbSetCells = pool->nbSetCells + __denom;
  pacVar5 = pool->lastPage;
  pacVar6 = addr;
  pacVar15 = addr;
  for (; __denom != 0; __denom = __denom - 1) {
    if (pacVar5 != (Page *)0x0) {
      *(ulong *)*pacVar5 = CONCAT71((int7)((ulong)pacVar15 >> 8),(*pacVar5)[0]);
    }
    uVar20 = *(ulong *)*pacVar6;
    *(ulong *)*pacVar6 = uVar20 & 0xfffffffffffffff0;
    *(ulong *)*pacVar6 = uVar20 & 0xffffffffffffff00 | (ulong)(pool->generation & 0xf);
    *(undefined8 *)(*pacVar6 + 8) = *(undefined8 *)((long)pvVar9 + 8);
    *(char *)((long)pacVar6 + 0x10) = '\0';
    *(char *)((long)pacVar6 + 0x11) = '\0';
    *(char *)((long)pacVar6 + 0x12) = '\0';
    *(char *)((long)pacVar6 + 0x13) = '\0';
    *(char *)((long)pacVar6 + 0x14) = '\0';
    *(char *)((long)pacVar6 + 0x15) = '\0';
    *(char *)((long)pacVar6 + 0x16) = '\0';
    *(char *)((long)pacVar6 + 0x17) = '\0';
    *(char *)((long)pacVar6 + 0x18) = '\0';
    *(char *)((long)pacVar6 + 0x19) = '\0';
    *(char *)((long)pacVar6 + 0x1a) = '\0';
    *(char *)((long)pacVar6 + 0x1b) = '\0';
    *(char *)((long)pacVar6 + 0x1c) = '\0';
    *(char *)((long)pacVar6 + 0x1d) = '\0';
    *(char *)((long)pacVar6 + 0x1e) = '\0';
    *(char *)((long)pacVar6 + 0x1f) = '\0';
    (*pacVar6)[0x10] = '\x01';
    pacVar15 = pacVar15 + 1;
    pacVar5 = pacVar6;
    pacVar6 = pacVar6 + 1;
  }
  pool->lastPage = pacVar5;
  (*addr)[0] = (*addr)[0] | 0x10;
  *(ulong *)*pacVar5 = (ulong)(byte)(*pacVar5)[0] | 0x20;
  return;
}

Assistant:

void
PoolAllocPages(
    MemoryPool *pool,   /*!< Pool to allocate pages into. */
    size_t number)      /*!< Number of pages to allocate. */
{
    ThreadData *data = PlatGetThreadData();
    Page *base, *page, *prev;
    const size_t nbPagesPerSysPage = systemPageSize/PAGE_SIZE;
    size_t nbSysPages, nbPages;
    size_t i;

    if (number == 1) {
        /*
         * Regular case: allocate one physical page divided into equally sized
         * logical pages.
         */

        nbSysPages = 1;
        nbPages = nbPagesPerSysPage;
    } else {
        /*
         * Allocate enough physical pages for the given number of logical pages.
         */

        lldiv_t d = lldiv(number, nbPagesPerSysPage);
        nbSysPages = d.quot + (d.rem?1:0);
        if (nbSysPages >= LARGE_PAGE_SIZE) {
            /*
             * Pages are in their own dedicated range.
             */

            nbPages = 1;
        } else {
            nbPages = (nbSysPages * nbPagesPerSysPage) - number + 1;
        }
    }

    /*
     * Allocate system pages. Make sure to mark pages as written for older
     * generations for proper parent tracking.
     */

    base = (Page *) SysPageAlloc(nbSysPages, (pool->generation >= 2));

    if (!pool->pages) {
        pool->pages = base;
        for (i = 0; i < AVAILABLE_CELLS; i++) {
            pool->lastFreeCell[i] = PAGE_CELL(base, 0);
        }
    }

    pool->nbPages += nbPages;
    pool->nbAlloc += nbPages;
    pool->nbSetCells += RESERVED_CELLS*nbPages;

    /*
     * Initialize pages.
     */

    prev = pool->lastPage;
    for (i = 0, page = base; i < nbPages; i++, page++) {
        /*
         * Pages are linked in order.
         */

        if (prev) {
            PAGE_SET_NEXT(prev, page);
        }
        prev = page;

        PAGE_SET_GENERATION(page, pool->generation);
        PAGE_CLEAR_FLAG(page, PAGE_FLAGS_MASK);
        PAGE_GROUPDATA(page) = data->groupData;

        /* Initialize bit mask for allocated cells. */
        ClearAllCells(page);
    }
    pool->lastPage = prev;
    PAGE_SET_FLAG(base, PAGE_FLAG_FIRST);
    PAGE_SET_NEXT(prev, NULL);
    PAGE_SET_FLAG(prev, PAGE_FLAG_LAST);
}